

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::parseTopLevelItems(Parser *this,ScannedTopLevelItem *item)

{
  pool_ptr<soul::Module> *this_00;
  char *pcVar1;
  pointer pUVar2;
  char *pcVar3;
  Module *pMVar4;
  Function *f;
  size_t i_2;
  size_t i;
  ulong uVar5;
  UTF8Reader local_50;
  UTF8Reader local_48;
  UTF8Reader local_40;
  UTF8Reader local_38;
  
  pcVar1 = (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.location.data;
  this_00 = &this->module;
  for (uVar5 = 0;
      pUVar2 = (item->inputDecls).
               super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(item->inputDecls).
                            super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pUVar2 >> 3);
      uVar5 = uVar5 + 1) {
    local_40.data = pUVar2[uVar5].data;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    resetPosition(&this->
                   super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ,&local_40);
    pMVar4 = pool_ptr<soul::Module>::operator->(this_00);
    parseInput(this,(pMVar4->inputs).
                    super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar5].object);
  }
  for (uVar5 = 0;
      pUVar2 = (item->outputDecls).
               super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(item->outputDecls).
                            super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pUVar2 >> 3);
      uVar5 = uVar5 + 1) {
    local_48.data = pUVar2[uVar5].data;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    resetPosition(&this->
                   super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ,&local_48);
    pMVar4 = pool_ptr<soul::Module>::operator->(this_00);
    parseOutput(this,(pMVar4->outputs).
                     super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar5].object);
  }
  for (uVar5 = 0;
      pUVar2 = (item->functionBodyCode).
               super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(item->functionBodyCode).
                            super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pUVar2 >> 3);
      uVar5 = uVar5 + 1) {
    pcVar3 = pUVar2[uVar5].data;
    if (pcVar3 != (char *)0x0) {
      local_50.data = pcVar3;
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      resetPosition(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,&local_50);
      pMVar4 = pool_ptr<soul::Module>::operator->(this_00);
      f = Module::Functions::at(&pMVar4->functions,uVar5);
      parseFunctionBody(this,f);
    }
  }
  local_38.data = pcVar1;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  resetPosition(&this->
                 super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ,&local_38);
  return;
}

Assistant:

void parseTopLevelItems (ScannedTopLevelItem& item)
    {
        auto nextItemPos = getCurrentTokeniserPosition();

        for (size_t i = 0; i < item.inputDecls.size(); ++i)
        {
            resetPosition (item.inputDecls[i]);
            parseInput (module->inputs[i]);
        }

        for (size_t i = 0; i < item.outputDecls.size(); ++i)
        {
            resetPosition (item.outputDecls[i]);
            parseOutput (module->outputs[i]);
        }

        for (size_t i = 0; i < item.functionBodyCode.size(); ++i)
        {
            if (item.functionBodyCode[i] != UTF8Reader())
            {
                resetPosition (item.functionBodyCode[i]);
                parseFunctionBody (module->functions.at (i));
            }
        }

        resetPosition (nextItemPos);
    }